

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydataops.h
# Opt level: O3

void __thiscall
QtPrivate::QCommonArrayOps<QSslCertificate>::growAppend
          (QCommonArrayOps<QSslCertificate> *this,QSslCertificate *b,QSslCertificate *e)

{
  long n;
  QSslCertificate *pQVar1;
  long in_FS_OFFSET;
  QArrayDataPointer<QSslCertificate> local_48;
  QSslCertificate *local_28;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  local_28 = b;
  if (b != e) {
    n = (long)e - (long)b >> 3;
    local_48.d = (Data *)0x0;
    local_48.ptr = (QSslCertificate *)0x0;
    local_48.size = 0;
    pQVar1 = (this->super_Type).super_QGenericArrayOps<QSslCertificate>.
             super_QArrayDataPointer<QSslCertificate>.ptr;
    if ((b < pQVar1) ||
       (pQVar1 + (this->super_Type).super_QGenericArrayOps<QSslCertificate>.
                 super_QArrayDataPointer<QSslCertificate>.size <= b)) {
      QArrayDataPointer<QSslCertificate>::detachAndGrow
                ((QArrayDataPointer<QSslCertificate> *)this,GrowsAtEnd,n,(QSslCertificate **)0x0,
                 (QArrayDataPointer<QSslCertificate> *)0x0);
      pQVar1 = b;
    }
    else {
      QArrayDataPointer<QSslCertificate>::detachAndGrow
                ((QArrayDataPointer<QSslCertificate> *)this,GrowsAtEnd,n,&local_28,&local_48);
      pQVar1 = local_28;
    }
    QGenericArrayOps<QSslCertificate>::copyAppend
              ((QGenericArrayOps<QSslCertificate> *)this,pQVar1,
               (QSslCertificate *)(((long)e - (long)b) + (long)pQVar1));
    QArrayDataPointer<QSslCertificate>::~QArrayDataPointer(&local_48);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void growAppend(const T *b, const T *e)
    {
        if (b == e)
            return;
        Q_ASSERT(b < e);
        const qsizetype n = e - b;
        DataPointer old;

        // points into range:
        if (QtPrivate::q_points_into_range(b, *this))
            this->detachAndGrow(QArrayData::GrowsAtEnd, n, &b, &old);
        else
            this->detachAndGrow(QArrayData::GrowsAtEnd, n, nullptr, nullptr);
        Q_ASSERT(this->freeSpaceAtEnd() >= n);
        // b might be updated so use [b, n)
        this->copyAppend(b, b + n);
    }